

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::Boxed_Number::go<signed_char,double>
          (Boxed_Number *this,Opers t_oper,Boxed_Value *t_bv,char *t_lhs,char *c_lhs,double *c_rhs)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  char cVar2;
  undefined8 *puVar3;
  bool bVar4;
  bool bVar5;
  double dVar6;
  Boxed_Value BVar7;
  double local_10;
  
  switch(t_oper) {
  case equals:
    bVar4 = (double)(int)*c_lhs == *c_rhs;
    break;
  case less_than:
    bVar4 = *c_rhs == (double)(int)*c_lhs;
    bVar5 = *c_rhs < (double)(int)*c_lhs;
    goto LAB_0031765b;
  case greater_than:
    bVar4 = (double)(int)*c_lhs == *c_rhs;
    bVar5 = (double)(int)*c_lhs < *c_rhs;
LAB_0031765b:
    bVar4 = !bVar5 && !bVar4;
    goto LAB_0031769d;
  case less_than_equal:
    bVar4 = *c_rhs < (double)(int)*c_lhs;
    goto LAB_00317633;
  case greater_than_equal:
    bVar4 = (double)(int)*c_lhs < *c_rhs;
LAB_00317633:
    bVar4 = !bVar4;
    goto LAB_0031769d;
  case not_equal:
    bVar4 = (double)(int)*c_lhs != *c_rhs;
    break;
  default:
    switch(t_oper) {
    case sum:
      local_10 = (double)(int)*c_lhs + *c_rhs;
      break;
    case quotient:
      local_10 = (double)(int)*c_lhs / *c_rhs;
      break;
    case product:
      local_10 = (double)(int)*c_lhs * *c_rhs;
      break;
    case difference:
      local_10 = (double)(int)*c_lhs - *c_rhs;
      break;
    default:
      if (t_lhs == (char *)0x0) {
switchD_003175f4_caseD_7:
        puVar3 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar3 = &PTR__bad_cast_003fbde8;
        __cxa_throw(puVar3,&detail::exception::bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      switch(t_oper) {
      case assign:
        cVar2 = (char)(int)*c_rhs;
        goto LAB_003176e5;
      default:
        goto switchD_003175f4_caseD_7;
      case assign_product:
        dVar6 = (double)(int)*t_lhs * *c_rhs;
        break;
      case assign_sum:
        dVar6 = (double)(int)*t_lhs + *c_rhs;
        break;
      case assign_quotient:
        dVar6 = (double)(int)*t_lhs / *c_rhs;
        break;
      case assign_difference:
        dVar6 = (double)(int)*t_lhs - *c_rhs;
      }
      cVar2 = (char)(int)dVar6;
LAB_003176e5:
      *t_lhs = cVar2;
      (this->bv).m_data.
      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (t_bv->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var1 = (t_bv->m_data).
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (this->bv).m_data.
      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Var1;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        }
      }
      goto LAB_003176a2;
    }
    BVar7 = detail::const_var_impl<double>((detail *)this,&local_10);
    t_bv = BVar7.m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
    goto LAB_003176a2;
  }
  bVar4 = (bool)(-bVar4 & 1);
LAB_0031769d:
  BVar7 = const_var((chaiscript *)this,bVar4);
  t_bv = BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
LAB_003176a2:
  BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)t_bv;
  BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto go(Operators::Opers t_oper, const Boxed_Value &t_bv, LHS *t_lhs, const LHS &c_lhs, const RHS &c_rhs) {
      switch (t_oper) {
        case Operators::Opers::equals:
          return const_var(c_lhs == c_rhs);
        case Operators::Opers::less_than:
          return const_var(c_lhs < c_rhs);
        case Operators::Opers::greater_than:
          return const_var(c_lhs > c_rhs);
        case Operators::Opers::less_than_equal:
          return const_var(c_lhs <= c_rhs);
        case Operators::Opers::greater_than_equal:
          return const_var(c_lhs >= c_rhs);
        case Operators::Opers::not_equal:
          return const_var(c_lhs != c_rhs);
        case Operators::Opers::sum:
          return const_var(c_lhs + c_rhs);
        case Operators::Opers::quotient:
          check_divide_by_zero(c_rhs);
          return const_var(c_lhs / c_rhs);
        case Operators::Opers::product:
          return const_var(c_lhs * c_rhs);
        case Operators::Opers::difference:
          return const_var(c_lhs - c_rhs);
        default:
          break;
      }

      if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
        switch (t_oper) {
          case Operators::Opers::shift_left:
            return const_var(c_lhs << c_rhs);
          case Operators::Opers::shift_right:
            return const_var(c_lhs >> c_rhs);
          case Operators::Opers::remainder:
            check_divide_by_zero(c_rhs);
            return const_var(c_lhs % c_rhs);
          case Operators::Opers::bitwise_and:
            return const_var(c_lhs & c_rhs);
          case Operators::Opers::bitwise_or:
            return const_var(c_lhs | c_rhs);
          case Operators::Opers::bitwise_xor:
            return const_var(c_lhs ^ c_rhs);
          default:
            break;
        }
      }

      if (t_lhs) {
        switch (t_oper) {
          case Operators::Opers::assign:
            *t_lhs = c_rhs;
            return t_bv;
          case Operators::Opers::assign_product:
            *t_lhs *= c_rhs;
            return t_bv;
          case Operators::Opers::assign_sum:
            *t_lhs += c_rhs;
            return t_bv;
          case Operators::Opers::assign_quotient:
            check_divide_by_zero(c_rhs);
            *t_lhs /= c_rhs;
            return t_bv;
          case Operators::Opers::assign_difference:
            *t_lhs -= c_rhs;
            return t_bv;
          default:
            break;
        }

        if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
          switch (t_oper) {
            case Operators::Opers::assign_bitwise_and:
              check_divide_by_zero(c_rhs);
              *t_lhs &= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_or:
              *t_lhs |= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_left:
              *t_lhs <<= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_right:
              *t_lhs >>= c_rhs;
              return t_bv;
            case Operators::Opers::assign_remainder:
              *t_lhs %= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_xor:
              *t_lhs ^= c_rhs;
              return t_bv;
            default:
              break;
          }
        }
      }

      throw chaiscript::detail::exception::bad_any_cast();
    }